

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::epsZero(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *__return_storage_ptr__,
         SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this)

{
  Real val;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,
             &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  val = Tolerances::epsilon(local_20._M_ptr);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,val,(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

R epsZero() const
   {
      return this->tolerances()->epsilon();
   }